

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void __thiscall cmDependsFortran::MatchLocalModules(cmDependsFortran *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  
  p_Var1 = (this->Internal->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->Internal->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      ConsiderModule(this,(string *)(p_Var1 + 1),&(this->super_cmDepends).TargetDirectory);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void cmDependsFortran::MatchLocalModules()
{
  std::string const& stampDir = this->TargetDirectory;
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    this->ConsiderModule(i, stampDir);
  }
}